

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall
OpenMD::NameFinder::matchRigidAtoms
          (NameFinder *this,string *molName,string *rbName,string *rbAtomName,SelectionSet *bs)

{
  bool bVar1;
  iterator k;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  rbAtomNodes;
  iterator j;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  rbNodes;
  iterator i;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  SelectionSet *in_stack_fffffffffffffee8;
  SelectionSet *in_stack_fffffffffffffef0;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  *this_00;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_e8;
  SelectionSet local_e0;
  string *in_stack_ffffffffffffff38;
  TreeNodePtr *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_a8;
  SelectionSet local_a0;
  shared_ptr<OpenMD::TreeNode> *local_78;
  shared_ptr<OpenMD::TreeNode> *local_70;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_68 [3];
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_50 [3];
  
  this_00 = local_50;
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
             (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
  getMatchedChildren((NameFinder *)in_stack_ffffffffffffff48._M_current,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2efa20);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  ::__normal_iterator(local_68);
  local_70 = (shared_ptr<OpenMD::TreeNode> *)
             std::
             vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
  local_68[0]._M_current = local_70;
  while( true ) {
    local_78 = (shared_ptr<OpenMD::TreeNode> *)
               std::
               vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator*(local_68);
    in_stack_fffffffffffffef0 = &local_a0;
    std::shared_ptr<OpenMD::TreeNode>::shared_ptr
              ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
    getMatchedChildren((NameFinder *)in_stack_ffffffffffffff48._M_current,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2efacf);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::__normal_iterator(&local_a8);
    local_a8._M_current =
         (shared_ptr<OpenMD::TreeNode> *)
         std::
         vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
         ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_fffffffffffffee8);
    while( true ) {
      in_stack_ffffffffffffff48 =
           std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_fffffffffffffee8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator*(&local_a8);
      in_stack_fffffffffffffee8 = &local_e0;
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
      getMatchedChildren((NameFinder *)in_stack_ffffffffffffff48._M_current,
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2efb61);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::__normal_iterator(&local_e8);
      local_e8._M_current =
           (shared_ptr<OpenMD::TreeNode> *)
           std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    *)in_stack_fffffffffffffee8);
      while( true ) {
        std::
        vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
        ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               *)in_stack_fffffffffffffee8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator*(&local_e8);
        std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2efbbd);
        SelectionSet::operator|=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator++(&local_e8);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator++(&local_a8);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector(this_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator++(local_68);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(this_00);
  return;
}

Assistant:

void NameFinder::matchRigidAtoms(const std::string& molName,
                                   const std::string& rbName,
                                   const std::string& rbAtomName,
                                   SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> rbNodes = getMatchedChildren(*i, rbName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = rbNodes.begin(); j != rbNodes.end(); ++j) {
        std::vector<TreeNodePtr> rbAtomNodes =
            getMatchedChildren(*j, rbAtomName);
        std::vector<TreeNodePtr>::iterator k;
        for (k = rbAtomNodes.begin(); k != rbAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }